

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# botp.c
# Opt level: O2

err_t botpTOTPVerify(char *otp,octet *key,size_t key_len,tm_time_t t)

{
  bool_t bVar1;
  size_t sVar2;
  blob_t state;
  err_t eVar3;
  
  bVar1 = strIsValid(otp);
  eVar3 = 0x206;
  if (((bVar1 != 0) && (sVar2 = strLen(otp), 5 < sVar2)) && (sVar2 = strLen(otp), sVar2 < 9)) {
    if (t == -1) {
      eVar3 = 0x133;
    }
    else {
      bVar1 = memIsValid(key,key_len);
      if (bVar1 == 0) {
        eVar3 = 0x6d;
      }
      else {
        sVar2 = botpTOTP_keep();
        state = blobCreate(sVar2);
        if (state == (blob_t)0x0) {
          eVar3 = 0x6e;
        }
        else {
          sVar2 = strLen(otp);
          botpTOTPStart(state,sVar2,key,key_len);
          bVar1 = botpTOTPStepV(otp,t,state);
          blobClose(state);
          eVar3 = 0x206;
          if (bVar1 != 0) {
            eVar3 = 0;
          }
        }
      }
    }
  }
  return eVar3;
}

Assistant:

err_t botpTOTPVerify(const char* otp, const octet key[], size_t key_len, 
	tm_time_t t)
{
	void* state;
	bool_t success;
	// проверить входные данные
	if (!strIsValid(otp) || strLen(otp) < 6 || strLen(otp) > 8)
		return ERR_BAD_PWD;
	if (t == TIME_ERR)
		return ERR_BAD_TIME;
	if (!memIsValid(key, key_len))
		return ERR_BAD_INPUT;
	// создать состояние
	state = blobCreate(botpTOTP_keep());
	if (state == 0)
		return ERR_OUTOFMEMORY;
	// проверить пароль
	botpTOTPStart(state, strLen(otp), key, key_len);
	success = botpTOTPStepV(otp, t, state);
	// завершить
	blobClose(state);
	return success ? ERR_OK : ERR_BAD_PWD;
}